

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

int open_log(void)

{
  byte bVar1;
  int iVar2;
  tm *__tp;
  tm *local_now;
  time_t now;
  
  time((time_t *)&local_now);
  __tp = localtime((time_t *)&local_now);
  strftime(file_name,0x32,"%d_%m_%Y_%H_%M.csv",__tp);
  std::ofstream::open(log_file,0x109530);
  bVar1 = std::ofstream::is_open();
  iVar2 = -1;
  if ((bVar1 & 1) != 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int open_log()
{
    time_t now;
    time(&now);

    tm *local_now;
    local_now = localtime(&now);

    strftime(file_name, 50, "%d_%m_%Y_%H_%M.csv", local_now);

    log_file.open(file_name, ios_base::out);

    return (log_file.is_open() ? 0 : -1);
}